

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::iterate
          (ProgramInterfaceQueryTestCase *this)

{
  undefined1 *puVar1;
  RenderContext **ppRVar2;
  pointer *ppuVar3;
  ProgramInterface PVar4;
  RenderContext *renderCtx;
  TestLog *pTVar5;
  pointer pbVar6;
  Context *pCVar7;
  PropValidator *pPVar8;
  bool bVar9;
  ShaderType type;
  int iVar10;
  Program *program_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  VariableSearchFilter VVar12;
  long *plVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TestError *this_00;
  pointer ppPVar14;
  _func_int **pp_Var15;
  TestLog *pTVar16;
  char *pcVar17;
  int ndx;
  pointer *pppPVar18;
  RenderContext **ppRVar19;
  long lVar20;
  long lVar21;
  ContextInfo **__x;
  ostringstream *poVar22;
  Storage storage;
  VariableSearchFilter variableFilter_1;
  long local_6d0;
  VariableSearchFilter variableFilter;
  iterator iStack_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetResources;
  ScopedLogSection section_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  BlockReferencedByShaderValidator referencedByGeometryVerifier;
  BlockReferencedByShaderValidator referencedByComputeVerifier;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators;
  BlockReferencedByShaderValidator referencedByTessControlVerifier;
  ScopedLogSection section;
  TransformFeedbackArraySizeValidator arraySizeValidator;
  BlockReferencedByShaderValidator referencedByFragmentVerifier;
  ScopedLogSection section_4;
  ScopedLogSection section_1;
  iterator iStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  char *local_458;
  undefined4 local_450;
  VariableSearchFilter local_44c;
  undefined4 local_444;
  VariableSearchFilter blockFilter;
  long local_430;
  RenderContext *local_428;
  ContextInfo *local_420;
  char *local_418;
  undefined4 local_410;
  VariableSearchFilter local_40c;
  undefined4 local_404;
  BlockReferencedByShaderValidator referencedByTessEvaluationVerifier;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  VariableReferencedByShaderValidator referencedByGeometryVerifier_1;
  VariableReferencedByShaderValidator referencedByComputeVerifier_2;
  MessageBuilder builder;
  VariableReferencedByShaderValidator referencedByTessControlVerifier_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ShaderProgram program;
  
  program_00 = getAndCheckProgramDefinition(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&targetResources,this);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources((ProgramSources *)&builder,program_00);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0xa8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x88);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&builder.m_log + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  puVar1 = &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  builder.m_log = (TestLog *)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"Program","");
  ppRVar2 = &arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
             m_renderContext;
  arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
  _vptr_PropValidator = (_func_int **)ppRVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&arraySizeValidator,"Program","");
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar5,(string *)&builder,(string *)&arraySizeValidator);
  if ((RenderContext **)
      arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
      _vptr_PropValidator != ppRVar2) {
    operator_delete(arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
                    _vptr_PropValidator,
                    (ulong)((long)&(arraySizeValidator.super_TransformFeedbackResourceValidator.
                                    super_PropValidator.m_renderContext)->_vptr_RenderContext + 1));
  }
  if (builder.m_log != (TestLog *)puVar1) {
    operator_delete(builder.m_log,
                    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ + 1);
  }
  pvVar11 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program_00)
  ;
  if ((pvVar11->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar11->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar22 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar22);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,
               "Transform feedback varyings: {",0x1e);
    lVar21 = 0;
    for (lVar20 = 0;
        pvVar11 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program_00),
        lVar20 < (int)((ulong)((long)(pvVar11->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar11->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar20 = lVar20 + 1) {
      if (lVar21 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,"\"",1);
      pvVar11 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program_00);
      pbVar6 = (pvVar11->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,
                 *(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar21),
                 *(long *)((long)&pbVar6->_M_string_length + lVar21));
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,"\"",1);
      lVar21 = lVar21 + 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,"}",1);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar22);
    std::ios_base::~ios_base
              ((ios_base *)
               &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar22 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar22);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar22->super_basic_ostream<char,_std::char_traits<char>_>,
               "Program build failed, checking if program exceeded implementation limits",0x48);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar22);
    std::ios_base::~ios_base
              ((ios_base *)
               &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    checkProgramResourceUsage
              (program_00,(Functions *)CONCAT44(extraout_var_04,iVar10),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    builder.m_log =
         (TestLog *)&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"could not build program","")
    ;
    tcu::TestError::TestError(this_00,(string *)&builder);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection(section.m_log);
  PVar4 = (this->m_queryTarget).interface;
  switch(PVar4) {
  case PROGRAMINTERFACE_UNIFORM:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_UNIFORM);
    pCVar7 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161020;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar7->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar7->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar7->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161120;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161200;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161248;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161290;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021612d8;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161320;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_LOCATION;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161368;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__021613b0;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__021613f8;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByComputeVerifier_2.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier_2.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier_2.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    unique0x1000330a = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier_1._44_8_ = variableFilter_1;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    referencedByComputeVerifier_2._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    referencedByComputeVerifier_2.m_shaderType = SHADERTYPE_VERTEX;
    pCVar7 = (this->super_TestCase).m_context;
    local_428 = pCVar7->m_renderCtx;
    local_420 = pCVar7->m_contextInfo;
    local_418 = (char *)0x0;
    local_410 = 0x400;
    blockFilter = (VariableSearchFilter)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    local_40c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_404 = 1;
    pCVar7 = (this->super_TestCase).m_context;
    local_468._M_allocated_capacity = (size_type)pCVar7->m_renderCtx;
    local_468._8_8_ = pCVar7->m_contextInfo;
    local_458 = (char *)0x0;
    local_450 = 0x400;
    section_1.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    local_44c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_444 = 5;
    pCVar7 = (this->super_TestCase).m_context;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier_3.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessControlVerifier_3.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier_3.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier_3.super_PropValidator.m_extension = "GL_EXT_tessellation_shader"
    ;
    referencedByTessControlVerifier_3.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    referencedByTessControlVerifier_3._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    referencedByTessControlVerifier_3.m_shaderType = SHADERTYPE_TESSELLATION_CONTROL;
    pCVar7 = (this->super_TestCase).m_context;
    __str._M_string_length = (size_type)pCVar7->m_testCtx;
    __str.field_2._M_allocated_capacity = (size_type)pCVar7->m_renderCtx;
    __str.field_2._8_8_ = pCVar7->m_contextInfo;
    __str._M_dataplus._M_p = (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._224_8_ = &__str;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x92fe;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x9301;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x92fd;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x9300;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x930e;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x92ff;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = &props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x92fc;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ = &validators;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ =
         &referencedByComputeVerifier_2;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ = &blockFilter;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._168_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = &section_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._184_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._192_8_ = &validators_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._200_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._208_8_ =
         &referencedByTessControlVerifier_3;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._216_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._232_4_ = 0x92fa;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._240_8_ =
         (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar20 = 0;
      do {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        variableFilter = (VariableSearchFilter)&local_6b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&variableFilter,"UniformResource","");
        std::operator+(&local_388,"Uniform resource \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_388);
        pTVar16 = (TestLog *)(plVar13 + 2);
        if ((TestLog *)*plVar13 == pTVar16) {
          local_678._M_allocated_capacity = (size_type)pTVar16->m_log;
          local_678._8_8_ = plVar13[3];
          section_2.m_log = (TestLog *)&local_678;
        }
        else {
          local_678._M_allocated_capacity = (size_type)pTVar16->m_log;
          section_2.m_log = (TestLog *)*plVar13;
        }
        *plVar13 = (long)pTVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_4,pTVar5,(string *)&variableFilter,(string *)&section_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_2.m_log != &local_678) {
          operator_delete(section_2.m_log,(ulong)(local_678._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (variableFilter != (VariableSearchFilter)&local_6b8) {
          operator_delete((void *)variableFilter,local_6b8._M_allocated_capacity + 1);
        }
        iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        variableFilter.m_shaderTypeBits = 0;
        variableFilter.m_storageBits = 0;
        iStack_6c0._M_current = (uint *)0x0;
        local_6b8._M_allocated_capacity = 0;
        local_678._M_allocated_capacity = 0;
        section_2.m_log = (TestLog *)0x0;
        lVar21 = 0x10;
        poVar22 = &builder.m_str;
        do {
          pPVar8 = (PropValidator *)
                   (poVar22->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
          ;
          if ((((this->m_queryTarget).propFlags & pPVar8->m_validationProp) != 0) &&
             (bVar9 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar8), bVar9)) {
            if (iStack_6c0._M_current == (uint *)local_6b8._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&variableFilter,
                         iStack_6c0,(uint *)((long)(poVar22 + -1) + 0x170));
            }
            else {
              *iStack_6c0._M_current = *(uint *)((long)(poVar22 + -1) + 0x170);
              iStack_6c0._M_current = iStack_6c0._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&section_2,(value_type *)poVar22);
          }
          poVar22 = (ostringstream *)
                    &(poVar22->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_02,iVar10),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&section_2);
        if (section_2.m_log != (TestLog *)0x0) {
          operator_delete(section_2.m_log,local_678._M_allocated_capacity - (long)section_2.m_log);
        }
        if (variableFilter != (VariableSearchFilter)0x0) {
          operator_delete((void *)variableFilter,
                          local_6b8._M_allocated_capacity - (long)variableFilter);
        }
        tcu::TestLog::endSection(section_4.m_log);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_UNIFORM_BLOCK:
  case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
    register0x00000000 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   ((PVar4 != PROGRAMINTERFACE_UNIFORM_BLOCK) + STORAGE_UNIFORM);
    pCVar7 = (this->super_TestCase).m_context;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar7->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar7->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar7->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_NAME_LENGTH;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161478;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    blockFilter = register0x00000000;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&blockFilter);
    pCVar7 = (this->super_TestCase).m_context;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    VVar12 = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                       ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByFragmentVerifier.super_PropValidator._44_4_ = VVar12.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = VVar12.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = SHADERTYPE_FRAGMENT;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    referencedByComputeVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByComputeVerifier.m_shaderType = SHADERTYPE_COMPUTE;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = "GL_EXT_geometry_shader";
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    referencedByGeometryVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByGeometryVerifier.m_shaderType = SHADERTYPE_GEOMETRY;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = "GL_EXT_tessellation_shader";
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    referencedByTessControlVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    referencedByTessControlVerifier.m_shaderType = SHADERTYPE_TESSELLATION_CONTROL;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension =
         "GL_EXT_tessellation_shader";
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021614d0;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    referencedByTessEvaluationVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&blockFilter);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessEvaluationVerifier;
    referencedByTessEvaluationVerifier.m_shaderType = SHADERTYPE_TESSELLATION_EVALUATION;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
         &referencedByGeometryVerifier_1;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BUFFER_BINDING;
    referencedByGeometryVerifier_1.super_PropValidator._44_4_ = blockFilter.m_shaderTypeBits;
    referencedByGeometryVerifier_1._48_4_ = blockFilter.m_storageBits;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161508;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92f9);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9302;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      ppuVar3 = &props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      lVar20 = 0;
      do {
        pppPVar18 = &validators.
                     super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&props,"BlockResource","");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referencedByComputeVerifier_2,"Interface block \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
        plVar13 = (long *)std::__cxx11::string::append((char *)&referencedByComputeVerifier_2);
        ppPVar14 = (pointer)(plVar13 + 2);
        if ((pointer)*plVar13 == ppPVar14) {
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar14;
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pppPVar18;
        }
        else {
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar14;
          validators.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
        }
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
        *plVar13 = (long)ppPVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_1,pTVar5,(string *)&props,(string *)&validators);
        if (validators.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppPVar18) {
          operator_delete(validators.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((RenderContext **)referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator
            != &referencedByComputeVerifier_2.super_PropValidator.m_renderContext) {
          operator_delete(referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByComputeVerifier_2.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((pointer *)
            props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar3) {
          operator_delete(props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        validators.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar21 = 8;
        poVar22 = &builder.m_str;
        do {
          pPVar8 = (PropValidator *)
                   (poVar22->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
          ;
          if ((((this->m_queryTarget).propFlags & pPVar8->m_validationProp) != 0) &&
             (bVar9 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar8), bVar9)) {
            if (props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&props,
                         (iterator)
                         props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
                         (uint *)((long)(poVar22 + -1) + 0x170));
            }
            else {
              *props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(uint *)((long)(poVar22 + -1) + 0x170);
              props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back(&validators,(value_type *)poVar22);
          }
          poVar22 = (ostringstream *)
                    &(poVar22->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var,iVar10),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_dataplus._M_p,program_00,
                   &props,&validators);
        if (validators.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(validators.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)validators.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)props.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        tcu::TestLog::endSection(section_1.m_log);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_PROGRAM_INPUT:
  case PROGRAMINTERFACE_PROGRAM_OUTPUT:
    if (PVar4 == PROGRAMINTERFACE_PROGRAM_INPUT) {
      type = ProgramInterfaceDefinition::Program::getFirstStage(program_00);
      if (type != SHADERTYPE_GEOMETRY) {
        if (type == SHADERTYPE_TESSELLATION_EVALUATION) {
          getMaxPatchVertices(this);
          type = SHADERTYPE_TESSELLATION_EVALUATION;
        }
        else if (type == SHADERTYPE_TESSELLATION_CONTROL) {
          getMaxPatchVertices(this);
          goto LAB_015805b4;
        }
      }
    }
    else {
      type = ProgramInterfaceDefinition::Program::getLastStage(program_00);
      if (type == SHADERTYPE_TESSELLATION_CONTROL) {
        ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program_00);
LAB_015805b4:
        type = SHADERTYPE_TESSELLATION_CONTROL;
      }
    }
    builder.m_log =
         (TestLog *)ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(type);
    storage = (Storage)(PVar4 != PROGRAMINTERFACE_PROGRAM_INPUT);
    section.m_log =
         (TestLog *)ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(storage);
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   (storage + STORAGE_PATCH_IN);
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::logicalOr
                   ((VariableSearchFilter *)&section,
                    (VariableSearchFilter *)&referencedByFragmentVerifier);
    variableFilter =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,(VariableSearchFilter *)&arraySizeValidator);
    pCVar7 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161020;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar7->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar7->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar7->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161120;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp = PROGRAMRESOURCEPROP_LOCATION
    ;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161368;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021613b0;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    referencedByComputeVerifier._44_8_ = variableFilter;
    unique0x10003302 = variableFilter;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    referencedByGeometryVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByGeometryVerifier.m_shaderType = SHADERTYPE_VERTEX;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    referencedByTessControlVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByTessControlVerifier.m_shaderType = SHADERTYPE_FRAGMENT;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    referencedByTessEvaluationVerifier._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByTessEvaluationVerifier.m_shaderType = SHADERTYPE_COMPUTE;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = "GL_EXT_geometry_shader";
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    referencedByGeometryVerifier_1._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter);
    referencedByGeometryVerifier_1.m_shaderType = SHADERTYPE_GEOMETRY;
    pCVar7 = (this->super_TestCase).m_context;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter);
    pCVar7 = (this->super_TestCase).m_context;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ = &validators;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByComputeVerifier_2.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ =
         &referencedByComputeVerifier_2;
    referencedByComputeVerifier_2.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier_2.super_PropValidator.m_extension = "GL_EXT_tessellation_shader";
    referencedByComputeVerifier_2.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_IS_PER_PATCH;
    referencedByComputeVerifier_2.super_PropValidator._44_4_ = variableFilter.m_shaderTypeBits;
    referencedByComputeVerifier_2._48_4_ = variableFilter.m_storageBits;
    referencedByComputeVerifier_2.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161548;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x930e;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = &props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x92fa;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x92e7;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ =
         (VariableSearchFilter *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      local_6d0 = 0;
      do {
        blockFilter = (VariableSearchFilter)&local_428;
        bVar9 = (this->m_queryTarget).interface == PROGRAMINTERFACE_PROGRAM_INPUT;
        pcVar17 = "Output";
        if (bVar9) {
          pcVar17 = "Input";
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&blockFilter,pcVar17,pcVar17 + (6 - (ulong)bVar9));
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        section_1.m_log = (TestLog *)&local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&section_1,"BlockResource","");
        ppRVar2 = &referencedByTessControlVerifier_3.super_PropValidator.m_renderContext;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,blockFilter,local_430 + (long)blockFilter);
        std::__cxx11::string::append((char *)&__str);
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str,
                                     (ulong)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[local_6d0].
                                            _M_dataplus._M_p);
        pp_Var15 = (_func_int **)(plVar13 + 2);
        if ((_func_int **)*plVar13 == pp_Var15) {
          referencedByTessControlVerifier_3.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var15;
          referencedByTessControlVerifier_3.super_PropValidator.m_contextInfo =
               (ContextInfo *)plVar13[3];
          referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator =
               (_func_int **)ppRVar2;
        }
        else {
          referencedByTessControlVerifier_3.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var15;
          referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator =
               (_func_int **)*plVar13;
        }
        referencedByTessControlVerifier_3.super_PropValidator.m_testCtx = (TestContext *)plVar13[1];
        *plVar13 = (long)pp_Var15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&referencedByTessControlVerifier_3);
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&validators_1.
                       super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppPVar14 = (pointer)(plVar13 + 2);
        if ((pointer)*plVar13 == ppPVar14) {
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar14;
        }
        else {
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppPVar14;
          validators_1.
          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
        }
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
        *plVar13 = (long)ppPVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_2,pTVar5,(string *)&section_1,(string *)&validators_1);
        if (validators_1.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&validators_1.
                      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(validators_1.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((RenderContext **)
            referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator != ppRVar2) {
          operator_delete(referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByTessControlVerifier_3.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_1.m_log != &local_468) {
          operator_delete(section_1.m_log,(ulong)(local_468._M_allocated_capacity + 1));
        }
        iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        section_1.m_log = (TestLog *)0x0;
        iStack_470._M_current = (uint *)0x0;
        local_468._M_allocated_capacity = 0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        validators_1.
        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar20 = 0xb;
        poVar22 = &builder.m_str;
        do {
          pPVar8 = (PropValidator *)
                   (poVar22->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
          ;
          if ((((this->m_queryTarget).propFlags & pPVar8->m_validationProp) != 0) &&
             (bVar9 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar8), bVar9)) {
            if (iStack_470._M_current == (uint *)local_468._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&section_1,iStack_470,
                         (uint *)((long)(poVar22 + -1) + 0x170));
            }
            else {
              *iStack_470._M_current = *(uint *)((long)(poVar22 + -1) + 0x170);
              iStack_470._M_current = iStack_470._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back(&validators_1,(value_type *)poVar22);
          }
          poVar22 = (ostringstream *)
                    &(poVar22->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_03,iVar10),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_6d0]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&section_1,&validators_1);
        if (validators_1.
            super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(validators_1.
                          super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)validators_1.
                                super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (section_1.m_log != (TestLog *)0x0) {
          operator_delete(section_1.m_log,local_468._M_allocated_capacity - (long)section_1.m_log);
        }
        tcu::TestLog::endSection(section_2.m_log);
        if (blockFilter != (VariableSearchFilter)&local_428) {
          operator_delete((void *)blockFilter,(ulong)((long)&local_428->_vptr_RenderContext + 1));
        }
        local_6d0 = local_6d0 + 1;
      } while (local_6d0 <
               (int)((ulong)((long)targetResources.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)targetResources.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
    pCVar7 = (this->super_TestCase).m_context;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)pCVar7->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = pCVar7->m_renderCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = pCVar7->m_contextInfo;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_4_ = 0x800;
    builder.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161670;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar7->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar7->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar7->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021616d0;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161718;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator._4_4_,0x92fb)
    ;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext =
         (RenderContext *)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_renderContext._4_4_,0x92f9);
    referencedByFragmentVerifier.super_PropValidator.m_extension =
         (char *)CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_extension._4_4_,0x92fa)
    ;
    referencedByFragmentVerifier.super_PropValidator._40_8_ = &builder;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = (TestContext *)&arraySizeValidator;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      ppRVar2 = &referencedByComputeVerifier.super_PropValidator.m_renderContext;
      lVar20 = 0;
      do {
        ppRVar19 = &referencedByGeometryVerifier.super_PropValidator.m_renderContext;
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        referencedByComputeVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)ppRVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&referencedByComputeVerifier,"XFBVariableResource","");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referencedByTessControlVerifier,"Transform feedback varying \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
        plVar13 = (long *)std::__cxx11::string::append((char *)&referencedByTessControlVerifier);
        pp_Var15 = (_func_int **)(plVar13 + 2);
        if ((_func_int **)*plVar13 == pp_Var15) {
          referencedByGeometryVerifier.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var15;
          referencedByGeometryVerifier.super_PropValidator.m_contextInfo = (ContextInfo *)plVar13[3]
          ;
          referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
               (_func_int **)ppRVar19;
        }
        else {
          referencedByGeometryVerifier.super_PropValidator.m_renderContext =
               (RenderContext *)*pp_Var15;
          referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
               (_func_int **)*plVar13;
        }
        referencedByGeometryVerifier.super_PropValidator.m_testCtx = (TestContext *)plVar13[1];
        *plVar13 = (long)pp_Var15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&referencedByTessEvaluationVerifier,pTVar5,
                   (string *)&referencedByComputeVerifier,(string *)&referencedByGeometryVerifier);
        if ((RenderContext **)referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator
            != ppRVar19) {
          operator_delete(referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByGeometryVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((RenderContext **)
            referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator !=
            &referencedByTessControlVerifier.super_PropValidator.m_renderContext) {
          operator_delete(referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByTessControlVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        if ((RenderContext **)referencedByComputeVerifier.super_PropValidator._vptr_PropValidator !=
            ppRVar2) {
          operator_delete(referencedByComputeVerifier.super_PropValidator._vptr_PropValidator,
                          (ulong)((long)&(referencedByComputeVerifier.super_PropValidator.
                                         m_renderContext)->_vptr_RenderContext + 1));
        }
        iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        referencedByComputeVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
        referencedByComputeVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
        referencedByComputeVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
        referencedByGeometryVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
        referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
        referencedByGeometryVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
        lVar21 = 3;
        __x = (ContextInfo **)&referencedByFragmentVerifier.super_PropValidator.m_testCtx;
        do {
          if (((this->m_queryTarget).propFlags &
              *(ProgramResourcePropFlags *)&(*__x)->m_compressedTextureFormats) != 0) {
            bVar9 = Functional::anon_unknown_0::PropValidator::isSupported((PropValidator *)*__x);
            if (bVar9) {
              if (referencedByComputeVerifier.super_PropValidator.m_testCtx ==
                  (TestContext *)referencedByComputeVerifier.super_PropValidator.m_renderContext) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           &referencedByComputeVerifier,
                           (iterator)referencedByComputeVerifier.super_PropValidator.m_testCtx,
                           (uint *)(__x + -1));
              }
              else {
                *(uint *)&(referencedByComputeVerifier.super_PropValidator.m_testCtx)->m_platform =
                     *(uint *)&((PropValidator *)(__x + -1))->_vptr_PropValidator;
                referencedByComputeVerifier.super_PropValidator.m_testCtx =
                     (TestContext *)
                     ((long)&(referencedByComputeVerifier.super_PropValidator.m_testCtx)->m_platform
                     + 4);
              }
              std::
              vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
              ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                           *)&referencedByGeometryVerifier,(value_type *)__x);
            }
          }
          __x = __x + 2;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_00,iVar10),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &referencedByComputeVerifier,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&referencedByGeometryVerifier);
        if (referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator !=
            (_func_int **)0x0) {
          operator_delete(referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator,
                          (long)referencedByGeometryVerifier.super_PropValidator.m_renderContext -
                          (long)referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator
                         );
        }
        if (referencedByComputeVerifier.super_PropValidator._vptr_PropValidator != (_func_int **)0x0
           ) {
          operator_delete(referencedByComputeVerifier.super_PropValidator._vptr_PropValidator,
                          (long)referencedByComputeVerifier.super_PropValidator.m_renderContext -
                          (long)referencedByComputeVerifier.super_PropValidator._vptr_PropValidator)
          ;
        }
        tcu::TestLog::endSection
                  ((TestLog *)
                   referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    break;
  case PROGRAMINTERFACE_BUFFER_VARIABLE:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_BUFFER);
    pCVar7 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161020;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar7->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar7->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar7->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161120;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161200;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161248;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161290;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021612d8;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_OFFSET;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021613f8;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021613b0;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    unique0x100032fa = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier_1._44_8_ = variableFilter_1;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(SHADERTYPE_VERTEX)
    ;
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar7 = (this->super_TestCase).m_context;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_FRAGMENT);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    pCVar7 = (this->super_TestCase).m_context;
    referencedByComputeVerifier_2.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByComputeVerifier_2.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier_2.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER;
    referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_COMPUTE);
    referencedByComputeVerifier_2._44_8_ =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,&variableFilter_1);
    referencedByComputeVerifier_2.m_shaderType = SHADERTYPE_COMPUTE;
    pCVar7 = (this->super_TestCase).m_context;
    local_428 = pCVar7->m_renderCtx;
    local_420 = pCVar7->m_contextInfo;
    local_418 = "GL_EXT_geometry_shader";
    local_410 = 0x400;
    blockFilter = (VariableSearchFilter)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_GEOMETRY);
    local_40c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_404 = 2;
    pCVar7 = (this->super_TestCase).m_context;
    local_468._M_allocated_capacity = (size_type)pCVar7->m_renderCtx;
    local_468._8_8_ = pCVar7->m_contextInfo;
    local_458 = "GL_EXT_tessellation_shader";
    local_450 = 0x400;
    section_1.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_CONTROL);
    local_44c = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                          ((VariableSearchFilter *)&builder,&variableFilter_1);
    local_444 = 3;
    pCVar7 = (this->super_TestCase).m_context;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar7->m_testCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar7->m_renderCtx;
    validators_1.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__02161440;
    builder.m_log =
         (TestLog *)
         ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                   (SHADERTYPE_TESSELLATION_EVALUATION);
    ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
              ((VariableSearchFilter *)&builder,&variableFilter_1);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._192_8_ = &validators_1;
    pCVar7 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier_3.super_PropValidator.m_testCtx = pCVar7->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._208_8_ =
         &referencedByTessControlVerifier_3;
    referencedByTessControlVerifier_3.super_PropValidator.m_renderContext = pCVar7->m_renderCtx;
    referencedByTessControlVerifier_3.super_PropValidator.m_contextInfo = pCVar7->m_contextInfo;
    referencedByTessControlVerifier_3.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier_3.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE;
    referencedByTessControlVerifier_3.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits
    ;
    referencedByTessControlVerifier_3._48_4_ = variableFilter_1.m_storageBits;
    referencedByTessControlVerifier_3.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__021615e0;
    __str._M_string_length = (size_type)pCVar7->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._224_8_ = &__str;
    __str.field_2._M_allocated_capacity = (size_type)pCVar7->m_renderCtx;
    __str.field_2._8_8_ = pCVar7->m_contextInfo;
    __str._M_dataplus._M_p = "2AX\x01";
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x92fe;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x92fd;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x9300;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x92ff;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x92fc;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = &props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ = &validators;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ =
         &referencedByComputeVerifier_2;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ = &blockFilter;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._168_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = &section_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._184_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._200_4_ = 0x930c;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._216_4_ = 0x930d;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._232_4_ = 0x92fa;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._240_8_ =
         (ContextInfo *)&section;
    if (0 < (int)((ulong)((long)targetResources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)targetResources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar20 = 0;
      do {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        variableFilter = (VariableSearchFilter)&local_6b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&variableFilter,"BufferVariableResource","");
        std::operator+(&local_388,"Buffer variable \"",
                       targetResources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_388);
        pTVar16 = (TestLog *)(plVar13 + 2);
        if ((TestLog *)*plVar13 == pTVar16) {
          local_678._M_allocated_capacity = (size_type)pTVar16->m_log;
          local_678._8_8_ = plVar13[3];
          section_2.m_log = (TestLog *)&local_678;
        }
        else {
          local_678._M_allocated_capacity = (size_type)pTVar16->m_log;
          section_2.m_log = (TestLog *)*plVar13;
        }
        *plVar13 = (long)pTVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_4,pTVar5,(string *)&variableFilter,(string *)&section_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)section_2.m_log != &local_678) {
          operator_delete(section_2.m_log,(ulong)(local_678._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (variableFilter != (VariableSearchFilter)&local_6b8) {
          operator_delete((void *)variableFilter,local_6b8._M_allocated_capacity + 1);
        }
        iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        variableFilter.m_shaderTypeBits = 0;
        variableFilter.m_storageBits = 0;
        iStack_6c0._M_current = (uint *)0x0;
        local_6b8._M_allocated_capacity = 0;
        local_678._M_allocated_capacity = 0;
        section_2.m_log = (TestLog *)0x0;
        lVar21 = 0x10;
        poVar22 = &builder.m_str;
        do {
          pPVar8 = (PropValidator *)
                   (poVar22->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
          ;
          if ((((this->m_queryTarget).propFlags & pPVar8->m_validationProp) != 0) &&
             (bVar9 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar8), bVar9)) {
            if (iStack_6c0._M_current == (uint *)local_6b8._M_allocated_capacity) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&variableFilter,
                         iStack_6c0,(uint *)((long)(poVar22 + -1) + 0x170));
            }
            else {
              *iStack_6c0._M_current = *(uint *)((long)(poVar22 + -1) + 0x170);
              iStack_6c0._M_current = iStack_6c0._M_current + 1;
            }
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&section_2,(value_type *)poVar22);
          }
          poVar22 = (ostringstream *)
                    &(poVar22->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        queryAndValidateProps
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (Functions *)CONCAT44(extraout_var_01,iVar10),program.m_program.m_program,
                   (this->m_queryTarget).interface,
                   targetResources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_dataplus._M_p,program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&section_2);
        if (section_2.m_log != (TestLog *)0x0) {
          operator_delete(section_2.m_log,local_678._M_allocated_capacity - (long)section_2.m_log);
        }
        if (variableFilter != (VariableSearchFilter)0x0) {
          operator_delete((void *)variableFilter,
                          local_6b8._M_allocated_capacity - (long)variableFilter);
        }
        tcu::TestLog::endSection(section_4.m_log);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)((long)targetResources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)targetResources.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&targetResources);
  return STOP;
}

Assistant:

ProgramInterfaceQueryTestCase::IterateResult ProgramInterfaceQueryTestCase::iterate (void)
{
	struct TestProperty
	{
		glw::GLenum				prop;
		const PropValidator*	validator;
	};

	const ProgramInterfaceDefinition::Program*	programDefinition	= getAndCheckProgramDefinition();
	const std::vector<std::string>				targetResources		= getQueryTargetResources();
	glu::ShaderProgram							program				(m_context.getRenderContext(), generateProgramInterfaceProgramSources(programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		// Feedback varyings
		if (!programDefinition->getTransformFeedbackVaryings().empty())
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());
			builder << "Transform feedback varyings: {";
			for (int ndx = 0; ndx < (int)programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
			{
				if (ndx)
					builder << ", ";
				builder << "\"" << programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
			checkProgramResourceUsage(programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

			// within limits
			throw tcu::TestError("could not build program");
		}
	}

	// Check interface props

	switch (m_queryTarget.interface)
	{
		case PROGRAMINTERFACE_UNIFORM:
		{
			const VariableSearchFilter					uniformFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_UNIFORM);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						uniformFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						-1,					uniformFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						uniformFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						uniformFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const AtomicCounterBufferIndexVerifier		atomicCounterBufferIndexVerifier	(m_context, program.getProgram(),						uniformFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						uniformFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						uniformFilter);
			const OffsetValidator						offsetVerifier						(m_context, program.getProgram(),						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	uniformFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_ATOMIC_COUNTER_BUFFER_INDEX,			&atomicCounterBufferIndexVerifier	},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetVerifier						},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "UniformResource", "Uniform resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_UNIFORM_BLOCK:
		case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
		{
			const glu::Storage						storage								= (m_queryTarget.interface == PROGRAMINTERFACE_UNIFORM_BLOCK) ? (glu::STORAGE_UNIFORM) : (glu::STORAGE_BUFFER);
			const VariableSearchFilter				blockFilter							= VariableSearchFilter::createStorageFilter(storage);

			const BlockNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						blockFilter);
			const BlockReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						blockFilter);
			const BlockReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	blockFilter);
			const BufferBindingValidator			bufferBindingValidator				(m_context, program.getProgram(),						blockFilter);

			const TestProperty allProperties[] =
			{
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_BUFFER_BINDING,						&bufferBindingValidator				},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BlockResource", "Interface block \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_PROGRAM_INPUT:
		case PROGRAMINTERFACE_PROGRAM_OUTPUT:
		{
			const bool									isInputCase							= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT);
			const glu::Storage							varyingStorage						= (isInputCase) ? (glu::STORAGE_IN) : (glu::STORAGE_OUT);
			const glu::Storage							patchStorage						= (isInputCase) ? (glu::STORAGE_PATCH_IN) : (glu::STORAGE_PATCH_OUT);
			const glu::ShaderType						shaderType							= (isInputCase) ? (programDefinition->getFirstStage()) : (programDefinition->getLastStage());
			const int									unsizedArraySize					= (isInputCase && shaderType == glu::SHADERTYPE_GEOMETRY)					? (1)															// input points
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (getMaxPatchVertices())										// input batch size
																							: (!isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (programDefinition->getTessellationNumOutputPatchVertices())	// output batch size
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? (getMaxPatchVertices())										// input batch size
																							: (-1);
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::logicalAnd(VariableSearchFilter::createShaderTypeFilter(shaderType),
																															   VariableSearchFilter::logicalOr(VariableSearchFilter::createStorageFilter(varyingStorage),
																																							   VariableSearchFilter::createStorageFilter(patchStorage)));

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						unsizedArraySize,		variableFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const PerPatchValidator						perPatchValidator					(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
				{ GL_IS_PER_PATCH,							&perPatchValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const std::string					resourceInterfaceName	= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT) ? ("Input") : ("Output");
				const tcu::ScopedLogSection			section					(m_testCtx.getLog(), "BlockResource", resourceInterfaceName + " resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl						= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_BUFFER_VARIABLE:
		{
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_BUFFER);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						0,					variableFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						variableFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						variableFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const OffsetValidator						offsetValidator						(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const TopLevelArraySizeValidator			topLevelArraySizeValidator			(m_context, program.getProgram(),						variableFilter);
			const TopLevelArrayStrideValidator			topLevelArrayStrideValidator		(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetValidator					},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TOP_LEVEL_ARRAY_SIZE,					&topLevelArraySizeValidator			},
				{ GL_TOP_LEVEL_ARRAY_STRIDE,				&topLevelArrayStrideValidator		},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BufferVariableResource", "Buffer variable \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
		{
			const TransformFeedbackTypeValidator		typeValidator			(m_context);
			const TransformFeedbackArraySizeValidator	arraySizeValidator		(m_context);
			const TransformFeedbackNameLengthValidator	nameLengthValidator		(m_context);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,					&arraySizeValidator				},
				{ GL_NAME_LENGTH,					&nameLengthValidator			},
				{ GL_TYPE,							&typeValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "XFBVariableResource", "Transform feedback varying \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		default:
			DE_ASSERT(false);
	}

	return STOP;
}